

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

shared_ptr<cppcms::http::file> __thiscall cppcms::widgets::file::value(file *this)

{
  cppcms_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  shared_ptr<cppcms::http::file> sVar1;
  allocator local_39;
  string local_38;
  
  if ((*(byte *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x1f0) & 2) != 0) {
    std::__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x11));
    sVar1.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<cppcms::http::file>)
           sVar1.super___shared_ptr<cppcms::http::file,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"File was not loaded",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

booster::shared_ptr<http::file> file::value()
{
	if(!set())
		throw cppcms_error("File was not loaded");
	return file_;
}